

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void putRGBcontig8bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  undefined1 *puVar1;
  undefined2 *puVar2;
  ulong uVar3;
  uint32_t uVar4;
  bool bVar5;
  
  uVar3 = (ulong)img->samplesperpixel;
LAB_0025c45f:
  bVar5 = h == 0;
  h = h - 1;
  uVar4 = w;
  if (bVar5) {
    return;
  }
  do {
    switch(uVar4) {
    case 0:
      goto switchD_0025c56f_caseD_0;
    case 7:
      *cp = *(uint3 *)pp | 0xff000000;
      cp = cp + 1;
      pp = (uchar *)((long)pp + uVar3);
    case 6:
      *cp = *(uint3 *)pp | 0xff000000;
      cp = cp + 1;
      pp = (uchar *)((long)pp + uVar3);
    case 5:
      *cp = *(uint3 *)pp | 0xff000000;
      cp = cp + 1;
      pp = (uchar *)((long)pp + uVar3);
    case 4:
      *cp = *(uint3 *)pp | 0xff000000;
      cp = cp + 1;
      pp = (uchar *)((long)pp + uVar3);
    case 3:
      *cp = *(uint3 *)pp | 0xff000000;
      cp = cp + 1;
      pp = (uchar *)((long)pp + uVar3);
    case 2:
      *cp = *(uint3 *)pp | 0xff000000;
      cp = cp + 1;
      pp = (uchar *)((long)pp + uVar3);
    case 1:
      *cp = *(uint3 *)pp | 0xff000000;
      cp = cp + 1;
      pp = (uchar *)((long)pp + uVar3);
      goto switchD_0025c56f_caseD_0;
    default:
      *cp = *(uint3 *)pp | 0xff000000;
      cp[1] = CONCAT12(*(undefined1 *)((long)pp + uVar3 + 2),*(undefined2 *)((long)pp + uVar3)) |
              0xff000000;
      cp[2] = CONCAT12(*(undefined1 *)((long)pp + uVar3 * 2 + 2),
                       *(undefined2 *)((long)pp + uVar3 * 2)) | 0xff000000;
      cp[3] = CONCAT12(*(undefined1 *)((long)pp + uVar3 * 3 + 2),
                       *(undefined2 *)((long)pp + uVar3 * 3)) | 0xff000000;
      cp[4] = CONCAT12(*(undefined1 *)((long)pp + uVar3 * 4 + 2),
                       (short)*(uint3 *)((long)pp + uVar3 * 4)) | 0xff000000;
      cp[5] = CONCAT12(*(undefined1 *)((long)pp + uVar3 * 5 + 2),
                       *(undefined2 *)((long)pp + uVar3 * 5)) | 0xff000000;
      cp[6] = CONCAT12(*(undefined1 *)((long)pp + uVar3 * 6 + 2),
                       *(undefined2 *)((long)pp + uVar3 * 6)) | 0xff000000;
      puVar2 = (undefined2 *)((long)pp + uVar3 * 7);
      puVar1 = (undefined1 *)((long)pp + uVar3 * 7 + 2);
      pp = (uchar *)((long)pp + uVar3 * 2 * 4);
      cp[7] = CONCAT12(*puVar1,*puVar2) | 0xff000000;
      cp = cp + 8;
      uVar4 = uVar4 - 8;
    }
  } while( true );
switchD_0025c56f_caseD_0:
  pp = (uchar *)((long)pp + (long)fromskew * uVar3);
  cp = cp + toskew;
  goto LAB_0025c45f;
}

Assistant:

DECLAREContigPutFunc(putRGBcontig8bittile)
{
    int samplesperpixel = img->samplesperpixel;

    (void)x;
    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        UNROLL8(w, NOP, *cp++ = PACK(pp[0], pp[1], pp[2]);
                pp += samplesperpixel);
        cp += toskew;
        pp += fromskew;
    }
}